

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall HighsMipSolverData::basisTransfer(HighsMipSolverData *this)

{
  uint uVar1;
  uint uVar2;
  HighsLp *pHVar3;
  HighsMipSolver *pHVar4;
  pointer piVar5;
  pointer pHVar6;
  ulong uVar7;
  ulong uVar8;
  value_type local_22;
  value_type local_21;
  
  if (this->mipsolver->rootbasis != (HighsBasis *)0x0) {
    pHVar3 = this->mipsolver->model_;
    uVar1 = pHVar3->num_row_;
    uVar2 = pHVar3->num_col_;
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::_M_fill_assign
              (&(this->firstrootbasis).col_status,(long)(int)uVar2,&local_21);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::_M_fill_assign
              (&(this->firstrootbasis).row_status,(long)(int)uVar1,&local_22);
    (this->firstrootbasis).valid = true;
    (this->firstrootbasis).alien = true;
    (this->firstrootbasis).useful = true;
    pHVar4 = this->mipsolver;
    piVar5 = (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar6 = (this->firstrootbasis).row_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pHVar6[uVar7] =
           (pHVar4->rootbasis->row_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start[piVar5[uVar7]];
    }
    pHVar4 = this->mipsolver;
    piVar5 = (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pHVar6 = (this->firstrootbasis).col_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    uVar7 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pHVar6[uVar8] =
           (pHVar4->rootbasis->col_status).
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start[piVar5[uVar8]];
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::basisTransfer() {
  // if a root basis is given, construct a basis for the root LP from
  // in the reduced problem space after presolving
  if (mipsolver.rootbasis) {
    const HighsInt numRow = mipsolver.numRow();
    const HighsInt numCol = mipsolver.numCol();
    firstrootbasis.col_status.assign(numCol, HighsBasisStatus::kNonbasic);
    firstrootbasis.row_status.assign(numRow, HighsBasisStatus::kNonbasic);
    firstrootbasis.valid = true;
    firstrootbasis.alien = true;
    firstrootbasis.useful = true;

    for (HighsInt i = 0; i < numRow; ++i) {
      HighsBasisStatus status =
          mipsolver.rootbasis->row_status[postSolveStack.getOrigRowIndex(i)];
      firstrootbasis.row_status[i] = status;
    }

    for (HighsInt i = 0; i < numCol; ++i) {
      HighsBasisStatus status =
          mipsolver.rootbasis->col_status[postSolveStack.getOrigColIndex(i)];
      firstrootbasis.col_status[i] = status;
    }
  }
}